

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

void __thiscall
kratos::Generator::replace
          (Generator *this,string *child_name,shared_ptr<kratos::Generator> *new_child)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  pointer __s1;
  pointer puVar2;
  element_type *peVar3;
  size_t new_var;
  undefined1 var [8];
  int iVar4;
  int iVar5;
  iterator iVar6;
  iterator iVar7;
  _Rb_tree_node_base *p_Var8;
  VarException *pVVar9;
  GeneratorException *this_00;
  _Base_ptr p_Var10;
  size_t __n;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  string_view format_str_05;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  initializer_list<const_kratos::IRNode_*> __l_02;
  initializer_list<const_kratos::IRNode_*> __l_03;
  initializer_list<kratos::IRNode_*> __l_04;
  undefined1 local_150 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_port_names;
  undefined1 local_118 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  old_port_names;
  shared_ptr<kratos::Port> new_port;
  undefined1 auStack_c8 [8];
  vector<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_> ports;
  undefined1 local_a8 [40];
  _Alloc_hider _Stack_80;
  undefined1 local_70 [8];
  mapped_type old_child;
  allocator_type local_31;
  
  iVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->children_)._M_h,child_name);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    this_00 = (GeneratorException *)__cxa_allocate_exception(0x10);
    local_a8._0_8_ = (child_name->_M_dataplus)._M_p;
    local_a8._8_8_ = child_name->_M_string_length;
    local_a8._16_8_ = (this->instance_name)._M_dataplus._M_p;
    local_a8._24_8_ = (this->instance_name)._M_string_length;
    format_str_04.size_ = 0xdd;
    format_str_04.data_ = (char *)0x1b;
    args_04.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_04.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_a8;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_118,(detail *)"Unable to find {0} from {1}",format_str_04,args_04);
    new_port_names._M_t._M_impl._0_8_ =
         (new_child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    __l_04._M_len = 2;
    __l_04._M_array = (iterator)local_150;
    local_150 = (undefined1  [8])this;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)local_a8,__l_04,
               (allocator_type *)
               &old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    GeneratorException::GeneratorException
              (this_00,(string *)local_118,
               (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)local_a8);
    __cxa_throw(this_00,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->children_)._M_h,child_name);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  local_70 = *(undefined1 (*) [8])
              ((long)iVar6.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
                     ._M_cur + 0x28);
  old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)
        ((long)iVar6.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
               ._M_cur + 0x30);
  if (old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar1 = &((old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->super_IRNode).fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar1 = &((old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->super_IRNode).fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  std::__cxx11::string::_M_assign
            ((string *)
             &((new_child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->instance_name);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_118,
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)local_70 + 0x130));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_150,
             &(((new_child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->ports_)._M_t);
  p_Var8 = old_port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  new_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)child_name;
  if (old_port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right !=
      new_port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right) {
    auStack_c8 = (undefined1  [8])0x0;
    ports.super__Vector_base<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ports.super__Vector_base<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>::reserve
              ((vector<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_> *)auStack_c8,
               (long)&(old_port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->
                      _M_color +
               (long)&(new_port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->
                      _M_color);
    if (old_port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Rb_tree_node_base *)&old_port_names) {
      p_Var10 = old_port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        get_port((Generator *)local_a8,(string *)local_70);
        old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
        std::vector<kratos::Var_const*,std::allocator<kratos::Var_const*>>::
        emplace_back<kratos::Port*>
                  ((vector<kratos::Var_const*,std::allocator<kratos::Var_const*>> *)auStack_c8,
                   (Port **)&old_child.
                             super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while (p_Var10 != (_Rb_tree_node_base *)&old_port_names);
    }
    if (new_port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Rb_tree_node_base *)&new_port_names) {
      p_Var10 = new_port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        get_port((Generator *)local_a8,
                 (string *)
                 (new_child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
        old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
        std::vector<kratos::Var_const*,std::allocator<kratos::Var_const*>>::
        emplace_back<kratos::Port*>
                  ((vector<kratos::Var_const*,std::allocator<kratos::Var_const*>> *)auStack_c8,
                   (Port **)&old_child.
                             super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while (p_Var10 != (_Rb_tree_node_base *)&new_port_names);
    }
    pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
    peVar3 = (new_child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_a8._0_8_ = (((string *)((long)local_70 + 0x78))->_M_dataplus)._M_p;
    local_a8._8_8_ = (((string *)((long)local_70 + 0x80))->_M_dataplus)._M_p;
    local_a8._16_8_ = (peVar3->name)._M_dataplus._M_p;
    local_a8._24_8_ = (peVar3->name)._M_string_length;
    format_str_05.size_ = 0xdd;
    format_str_05.data_ = (char *)0x2b;
    args_05.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_05.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_a8;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)
               &old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(detail *)"{0}\'s port interface doesn\'t match with {1}",format_str_05,
               args_05);
    VarException::VarException
              (pVVar9,(string *)
                      &old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(iterator)auStack_c8,
               (iterator)
               ports.super__Vector_base<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>.
               _M_impl.super__Vector_impl_data._M_start);
    __cxa_throw(pVVar9,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  do {
    if (p_Var8 == (_Rb_tree_node_base *)&old_port_names) {
      remove_child_generator(this,(shared_ptr<kratos::Generator> *)local_70);
      add_child_generator(this,(string *)
                               new_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          new_child);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_150);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_118);
      if (old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      return;
    }
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_150,(key_type *)(p_Var8 + 1));
    if (iVar7._M_node == (_Base_ptr)&new_port_names) {
      pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
      peVar3 = (new_child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_a8._0_8_ = (peVar3->name)._M_dataplus._M_p;
      local_a8._8_8_ = (peVar3->name)._M_string_length;
      local_a8._16_8_ = *(undefined8 *)(p_Var8 + 1);
      local_a8._24_8_ = p_Var8[1]._M_parent;
      format_str_02.size_ = 0xdd;
      format_str_02.data_ = (char *)0x19;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_a8;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(detail *)"{0} doesn\'t have port {1}",format_str_02,args_02);
      get_port((Generator *)auStack_c8,(string *)local_70);
      old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)auStack_c8;
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)&old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_a8
                 ,__l_02,(allocator_type *)
                         &new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      VarException::VarException
                (pVVar9,(string *)
                        &old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_a8
                );
      __cxa_throw(pVVar9,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    get_port((Generator *)auStack_c8,(string *)local_70);
    get_port((Generator *)&old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)
             (new_child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    var = auStack_c8;
    new_var = old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __s1 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)auStack_c8 + 0xa0))->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
    puVar2 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)auStack_c8 + 0xa0))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)puVar2 - (long)__s1;
    if ((__n != *(long *)(old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count + 0xa8) -
                (long)*(void **)(old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count +
                                0xa0)) ||
       ((puVar2 != __s1 &&
        (iVar4 = bcmp(__s1,*(void **)(old_port_names._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count + 0xa0),__n), iVar4 != 0)))) {
LAB_0016a68b:
      pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
      peVar3 = (new_child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_a8._0_8_ = (((string *)((long)local_70 + 0x78))->_M_dataplus)._M_p;
      local_a8._8_8_ = (((string *)((long)local_70 + 0x80))->_M_dataplus)._M_p;
      local_a8._16_8_ = *(undefined8 *)(p_Var8 + 1);
      local_a8._24_8_ = p_Var8[1]._M_parent;
      local_a8._32_8_ = (peVar3->name)._M_dataplus._M_p;
      _Stack_80._M_p = (pointer)(peVar3->name)._M_string_length;
      format_str.size_ = 0xddd;
      format_str.data_ = (char *)0x2d;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_a8;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(detail *)"{0}\'s port {1} has different width than {2}\'s",format_str
                 ,args);
      new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)var;
      __l._M_len = 2;
      __l._M_array = (iterator)
                     &new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_a8
                 ,__l,&local_31);
      VarException::VarException
                (pVVar9,(string *)
                        &old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_a8
                );
      __cxa_throw(pVVar9,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = (*((IRNode *)var)->_vptr_IRNode[7])(var);
    iVar5 = (**(code **)(*(long *)new_var + 0x38))(new_var);
    if (iVar4 != iVar5) goto LAB_0016a68b;
    if (*(bool *)((long)var + 0xf0) != (bool)*(char *)(new_var + 0xf0)) {
      pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
      peVar3 = (new_child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_a8._0_8_ = (((string *)((long)local_70 + 0x78))->_M_dataplus)._M_p;
      local_a8._8_8_ = (((string *)((long)local_70 + 0x80))->_M_dataplus)._M_p;
      local_a8._16_8_ = *(undefined8 *)(p_Var8 + 1);
      local_a8._24_8_ = p_Var8[1]._M_parent;
      local_a8._32_8_ = (peVar3->name)._M_dataplus._M_p;
      _Stack_80._M_p = (pointer)(peVar3->name)._M_string_length;
      format_str_03.size_ = 0xddd;
      format_str_03.data_ = (char *)0x2c;
      args_03.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_03.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_a8;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(detail *)"{0}\'s port {1} has different sign than {2}\'s",
                 format_str_03,args_03);
      new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)var;
      __l_03._M_len = 2;
      __l_03._M_array =
           (iterator)
           &new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_a8
                 ,__l_03,&local_31);
      VarException::VarException
                (pVVar9,(string *)
                        &old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_a8
                );
      __cxa_throw(pVVar9,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (*(int *)((long)&(((Var *)((long)var + 0x270))->super_IRNode)._vptr_IRNode + 4) !=
        *(int *)(new_var + 0x274)) {
      pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
      peVar3 = (new_child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_a8._0_8_ = (((string *)((long)local_70 + 0x78))->_M_dataplus)._M_p;
      local_a8._8_8_ = (((string *)((long)local_70 + 0x80))->_M_dataplus)._M_p;
      local_a8._16_8_ = *(undefined8 *)(p_Var8 + 1);
      local_a8._24_8_ = p_Var8[1]._M_parent;
      local_a8._32_8_ = (peVar3->name)._M_dataplus._M_p;
      _Stack_80._M_p = (pointer)(peVar3->name)._M_string_length;
      format_str_01.size_ = 0xddd;
      format_str_01.data_ = (char *)0x31;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_a8;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(detail *)"{0}\'s port {1} has different port type than {2}\'s",
                 format_str_01,args_01);
      new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)var;
      __l_01._M_len = 2;
      __l_01._M_array =
           (iterator)
           &new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_a8
                 ,__l_01,&local_31);
      VarException::VarException
                (pVVar9,(string *)
                        &old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_a8
                );
      __cxa_throw(pVVar9,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = *(int *)&(((Var *)((long)var + 0x270))->super_IRNode)._vptr_IRNode;
    if (iVar4 != *(int *)(new_var + 0x270)) {
      pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
      peVar3 = (new_child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_a8._0_8_ = (((string *)((long)local_70 + 0x78))->_M_dataplus)._M_p;
      local_a8._8_8_ = (((string *)((long)local_70 + 0x80))->_M_dataplus)._M_p;
      local_a8._16_8_ = *(undefined8 *)(p_Var8 + 1);
      local_a8._24_8_ = p_Var8[1]._M_parent;
      local_a8._32_8_ = (peVar3->name)._M_dataplus._M_p;
      _Stack_80._M_p = (pointer)(peVar3->name)._M_string_length;
      format_str_00.size_ = 0xddd;
      format_str_00.data_ = (char *)0x36;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_a8;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(detail *)"{0}\'s port {1} has different port direction than {2}\'s",
                 format_str_00,args_00);
      new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)var;
      __l_00._M_len = 2;
      __l_00._M_array =
           (iterator)
           &new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_a8
                 ,__l_00,&local_31);
      VarException::VarException
                (pVVar9,(string *)
                        &old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_a8
                );
      __cxa_throw(pVVar9,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (iVar4 == 1) {
LAB_0016a5eb:
      Var::move_sink_to((Var *)var,(Var *)new_var,this,false);
    }
    else {
      if (iVar4 != 0) {
        Var::move_src_to((Var *)var,(Var *)new_var,this,false);
        goto LAB_0016a5eb;
      }
      Var::move_src_to((Var *)var,(Var *)new_var,this,false);
    }
    if (new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (ports.super__Vector_base<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ports.super__Vector_base<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

void Generator::replace(const std::string &child_name,
                        const std::shared_ptr<Generator> &new_child) {
    // obtained the generator
    if (children_.find(child_name) == children_.end()) {
        throw GeneratorException(::format("Unable to find {0} from {1}", child_name, instance_name),
                                 {this, new_child.get()});
    }
    auto old_child = children_.at(child_name);
    new_child->instance_name = child_name;
    // first we need to make sure that the interfaces are the same
    auto old_port_names = old_child->get_port_names();
    auto new_port_names = new_child->get_port_names();
    if (old_port_names.size() != new_port_names.size()) {
        // doesn't match
        // show all the port definitions
        std::vector<const Var *> ports;
        ports.reserve(old_port_names.size() + new_port_names.size());
        for (auto const &port_name : old_port_names) {
            ports.emplace_back(old_child->get_port(port_name).get());
        }
        for (auto const &port_name : new_port_names) {
            ports.emplace_back(new_child->get_port(port_name).get());
        }
        throw VarException(::format("{0}'s port interface doesn't match with {1}", old_child->name,
                                    new_child->name),
                           ports.begin(), ports.end());
    }
    // check the name, type, and size
    for (const auto &port_name : old_port_names) {
        if (new_port_names.find(port_name) == new_port_names.end()) {
            // doesn't have the port
            throw VarException(::format("{0} doesn't have port {1}", new_child->name, port_name),
                               {old_child->get_port(port_name).get()});
        }
        auto old_port = old_child->get_port(port_name);
        auto new_port = new_child->get_port(port_name);
        // type checking
        if (old_port->size() != new_port->size() || old_port->width() != new_port->width()) {
            throw VarException(::format("{0}'s port {1} has different width than {2}'s",
                                        old_child->name, port_name, new_child->name),
                               {old_port.get(), new_port.get()});
        }
        if (old_port->is_signed() != new_port->is_signed()) {
            throw VarException(::format("{0}'s port {1} has different sign than {2}'s",
                                        old_child->name, port_name, new_child->name),
                               {old_port.get(), new_port.get()});
        }
        if (old_port->port_type() != new_port->port_type()) {
            throw VarException(::format("{0}'s port {1} has different port type than {2}'s",
                                        old_child->name, port_name, new_child->name),
                               {old_port.get(), new_port.get()});
        }
        if (old_port->port_direction() != new_port->port_direction()) {
            throw VarException(::format("{0}'s port {1} has different port direction than {2}'s",
                                        old_child->name, port_name, new_child->name),
                               {old_port.get(), new_port.get()});
        }

        // all passed, now replace the port!
        if (old_port->port_direction() == PortDirection::In) {
            // move the src
            Var::move_src_to(old_port.get(), new_port.get(), this, false);
        } else if (old_port->port_direction() == PortDirection::Out) {
            // move the sinks
            Var::move_sink_to(old_port.get(), new_port.get(), this, false);
        } else {
            // inout, move both source and sinks
            Var::move_src_to(old_port.get(), new_port.get(), this, false);
            Var::move_sink_to(old_port.get(), new_port.get(), this, false);
        }
    }

    // update other meta data info
    remove_child_generator(old_child);
    add_child_generator(child_name, new_child);
}